

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precomputed_scalar_reference_finite_element.h
# Opt level: O0

MatrixXd * __thiscall
lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,PrecomputedScalarReferenceFiniteElement<double> *this)

{
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  PrecomputedScalarReferenceFiniteElement<double> *local_18;
  PrecomputedScalarReferenceFiniteElement<double> *this_local;
  
  local_18 = this;
  this_local = (PrecomputedScalarReferenceFiniteElement<double> *)__return_storage_ptr__;
  if (this->fe_ == (ScalarReferenceFiniteElement<double> *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Not initialized.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"fe_ != nullptr",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/precomputed_scalar_reference_finite_element.h"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x7d,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/precomputed_scalar_reference_finite_element.h"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    lf::base::AssertionFailed(&local_240,&local_268,0x7d,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  (*this->fe_->_vptr_ScalarReferenceFiniteElement[9])(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    LF_ASSERT_MSG(fe_ != nullptr, "Not initialized.");
    return fe_->EvaluationNodes();
  }